

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAndEaRg<(moira::Instr)9,(moira::Mode)2,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint uVar2;
  u32 uVar3;
  ulong uVar4;
  uint uVar5;
  u32 data;
  u32 ea;
  uint local_20;
  u32 local_1c;
  
  bVar1 = readOp<(moira::Mode)2,(moira::Size)1,0ul>(this,opcode & 7,&local_1c,&local_20);
  if (bVar1) {
    uVar4 = (ulong)(opcode >> 9 & 7);
    uVar2 = local_20 & *(uint *)((long)this->exec + uVar4 * 4 + -0x58);
    uVar5 = uVar2 & 0xff;
    (this->reg).sr.n = 0x7f < uVar5;
    (this->reg).sr.z = uVar5 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    uVar3 = (this->reg).pc;
    (this->reg).pc0 = uVar3;
    (this->queue).ird = (this->queue).irc;
    uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
    (this->queue).irc = (u16)uVar3;
    *(char *)((long)this->exec + uVar4 * 4 + -0x58) = (char)uVar2;
  }
  return;
}

Assistant:

void
Moira::execAndEaRg(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    u32 result = logic<I,S>(data, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(isRegMode(M) || isImmMode(M) ? 4 : 2);
    writeD<S>(dst, result);
}